

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O1

UChar32 ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  UConverter *pUVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  
  pbVar4 = (byte *)args->source;
  if (args->sourceLimit <= pbVar4) {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0xffff;
  }
  pbVar10 = pbVar4 + 1;
  bVar2 = *pbVar4;
  if (-1 < (char)bVar2) {
    args->source = (char *)pbVar10;
    return (uint)bVar2;
  }
  uVar13 = 0;
  if ((byte)(bVar2 + 0x3e) < 0x33) {
    uVar13 = ((uint)(0xef < bVar2) - (uint)(bVar2 < 0xe0)) + 2;
  }
  pUVar5 = args->converter;
  if (uVar13 == 0) {
    pUVar5->toUBytes[0] = bVar2;
    pUVar5->toULength = '\x01';
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_002cb073:
    args->source = (char *)pbVar10;
    return 0xffff;
  }
  uVar7 = (uint)bVar2;
  if (args->sourceLimit < pbVar10 + uVar13) {
    pUVar5->toUBytes[0] = bVar2;
    *err = U_TRUNCATED_CHAR_FOUND;
    uVar13 = uVar13 + 1 & 0xffff;
    cVar11 = '\x01';
    for (; pbVar10 < args->sourceLimit; pbVar10 = pbVar10 + 1) {
      bVar3 = *pbVar10;
      if (uVar13 < 3 || '\x01' < cVar11) {
        bVar14 = (char)bVar3 < -0x40;
      }
      else if (uVar13 == 3) {
        bVar14 = '\x01' << (bVar3 >> 5) & " 000000000000\x1000"[uVar7 & 0xf];
      }
      else {
        bVar14 = ""[bVar3 >> 4] & '\x01' << (bVar2 & 7);
      }
      if (bVar14 == 0) {
        *err = U_ILLEGAL_CHAR_FOUND;
        break;
      }
      lVar9 = (long)cVar11;
      cVar11 = cVar11 + '\x01';
      pUVar5->toUBytes[lVar9] = bVar3;
    }
    pUVar5->toULength = cVar11;
    goto LAB_002cb073;
  }
  iVar8 = uVar7 * 0x40;
  bVar2 = *pbVar10;
  uVar12 = (uint)bVar2;
  if (uVar13 == 1) {
    if ((char)bVar2 < -0x40) {
      args->source = (char *)(pbVar4 + 2);
      return iVar8 + uVar12 + -0x3080;
    }
    goto LAB_002cb165;
  }
  if (uVar13 == 2) {
    uVar13 = (uint)(byte)" 000000000000\x1000"[uVar7 & 0xf];
    bVar6 = true;
    if (((byte)" 000000000000\x1000"[uVar7 & 0xf] >> (bVar2 >> 5) & 1) != 0) {
      pbVar10 = pbVar4 + 2;
      bVar2 = pbVar4[2];
      uVar13 = (uint)bVar2;
      if ((char)bVar2 < -0x40) {
        args->source = (char *)(pbVar4 + 3);
        uVar13 = ((uint)bVar2 + (iVar8 + uVar12) * 0x40) - 0xe2080;
LAB_002cb153:
        bVar6 = false;
      }
    }
  }
  else {
    uVar13 = uVar7 & 7;
    bVar6 = true;
    if (((byte)""[bVar2 >> 4] >> uVar13 & 1) != 0) {
      uVar13 = (uint)pbVar4[2];
      if ((char)pbVar4[2] < -0x40) {
        pbVar10 = pbVar4 + 3;
        bVar2 = pbVar4[3];
        if ((char)bVar2 < -0x40) {
          args->source = (char *)(pbVar4 + 4);
          uVar13 = uVar13 * 0x40 + (iVar8 + uVar12) * 0x1000 + (uint)bVar2 + 0xfc37df80;
          goto LAB_002cb153;
        }
      }
      else {
        pbVar10 = pbVar4 + 2;
      }
    }
  }
  if (!bVar6) {
    return uVar13;
  }
LAB_002cb165:
  args->source = (char *)pbVar10;
  lVar9 = 0;
  do {
    pbVar1 = pbVar4 + lVar9;
    pUVar5->toUBytes[(char)lVar9] = *pbVar1;
    lVar9 = lVar9 + 1;
  } while (pbVar1 + 1 < pbVar10);
  pUVar5->toULength = (int8_t)lVar9;
  *err = U_ILLEGAL_CHAR_FOUND;
  return 0xffff;
}

Assistant:

U_CDECL_BEGIN
static UChar32 U_CALLCONV ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,
                                               UErrorCode *err) {
    UConverter *cnv;
    const uint8_t *sourceInitial;
    const uint8_t *source;
    uint8_t myByte;
    UChar32 ch;
    int8_t i;

    /* UTF-8 only here, the framework handles CESU-8 to combine surrogate pairs */

    cnv = args->converter;
    sourceInitial = source = (const uint8_t *)args->source;
    if (source >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    myByte = (uint8_t)*(source++);
    if (U8_IS_SINGLE(myByte))
    {
        args->source = (const char *)source;
        return (UChar32)myByte;
    }

    uint16_t countTrailBytes = U8_COUNT_TRAIL_BYTES(myByte);
    if (countTrailBytes == 0) {
        cnv->toUBytes[0] = myByte;
        cnv->toULength = 1;
        *err = U_ILLEGAL_CHAR_FOUND;
        args->source = (const char *)source;
        return 0xffff;
    }

    /*The byte sequence is longer than the buffer area passed*/
    if (((const char *)source + countTrailBytes) > args->sourceLimit)
    {
        /* check if all of the remaining bytes are trail bytes */
        uint16_t extraBytesToWrite = countTrailBytes + 1;
        cnv->toUBytes[0] = myByte;
        i = 1;
        *err = U_TRUNCATED_CHAR_FOUND;
        while(source < (const uint8_t *)args->sourceLimit) {
            uint8_t b = *source;
            if(icu::UTF8::isValidTrail(myByte, b, i, extraBytesToWrite)) {
                cnv->toUBytes[i++] = b;
                ++source;
            } else {
                /* error even before we run out of input */
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
        cnv->toULength = i;
        args->source = (const char *)source;
        return 0xffff;
    }

    ch = myByte << 6;
    if(countTrailBytes == 2) {
        uint8_t t1 = *source, t2;
        if(U8_IS_VALID_LEAD3_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((ch + t1) << 6) + t2) - offsetsFromUTF8[3];
        }
    } else if(countTrailBytes == 1) {
        uint8_t t1 = *source;
        if(U8_IS_TRAIL(t1)) {
            args->source = (const char *)(source + 1);
            return (ch + t1) - offsetsFromUTF8[2];
        }
    } else {  // countTrailBytes == 3
        uint8_t t1 = *source, t2, t3;
        if(U8_IS_VALID_LEAD4_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source) &&
                U8_IS_TRAIL(t3 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((((ch + t1) << 6) + t2) << 6) + t3) - offsetsFromUTF8[4];
        }
    }
    args->source = (const char *)source;

    for(i = 0; sourceInitial < source; ++i) {
        cnv->toUBytes[i] = *sourceInitial++;
    }
    cnv->toULength = i;
    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}